

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O0

Reals Omega_h::repeat_symm<1>(LO n,Tensor<1> symm)

{
  LO in_ESI;
  undefined4 in_register_0000003c;
  Reals RVar1;
  Reals RVar2;
  LO n_local;
  Tensor<1> symm_local;
  undefined8 local_40;
  Vector<1> v;
  
  RVar2.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar2.write_.shared_alloc_.alloc._0_4_ = n;
  RVar1 = repeat_vector<1>((Omega_h *)CONCAT44(in_register_0000003c,n),in_ESI,local_40);
  RVar2.write_.shared_alloc_.direct_ptr = RVar1.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals repeat_symm(LO const n, Tensor<dim> const symm) {
  return repeat_vector(n, symm2vector(symm));
}